

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void acttab_action(acttab *p,int lookahead,int action)

{
  int *piVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  lookahead_action *plVar7;
  lookahead_action lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  lookahead_action *plVar13;
  lookahead_action lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  
  iVar6 = p->nLookahead;
  iVar15 = p->nLookaheadAlloc;
  if (iVar15 <= iVar6) {
    p->nLookaheadAlloc = iVar15 + 0x19;
    plVar13 = p->aLookahead;
    plVar7 = (lookahead_action *)realloc(plVar13,(long)iVar15 * 8 + 200);
    p->aLookahead = plVar7;
    if (plVar7 == (lookahead_action *)0x0) {
      acttab_action_cold_1();
      if (plVar13[4].action < 1) {
        __assert_fail("p->nLookahead>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                      ,0x229,"int acttab_insert(acttab *)");
      }
      uVar10 = plVar13->lookahead;
      uVar22 = plVar13->action;
      iVar6 = plVar13[4].lookahead + uVar10 + 1;
      if ((int)uVar22 <= iVar6) {
        iVar6 = iVar6 + uVar22 + 0x14;
        plVar13->action = iVar6;
        lVar14 = plVar13[1];
        lVar8 = (lookahead_action)realloc((void *)lVar14,(long)iVar6 << 3);
        plVar13[1] = lVar8;
        if (lVar8 == (lookahead_action)0x0) {
          acttab_insert_cold_1();
          lVar21 = *(long *)((long)lVar14 + 8);
          do {
            if (lVar21 == 0) {
              return;
            }
            if ((*(long *)(lVar21 + 0x50) == 0) && (0 < (long)*(int *)(lVar21 + 0x18))) {
              lVar11 = 0;
              lVar12 = 0;
              do {
                if (lVar12 != 0) break;
                lVar12 = *(long *)(*(long *)(lVar21 + 0x20) + lVar11 * 8);
                if (*(int *)(lVar12 + 0xc) == 2) {
                  piVar1 = (int *)(lVar12 + 0x54);
                  if (0 < (long)*piVar1) {
                    plVar2 = (long *)(lVar12 + 0x58);
                    lVar17 = 0;
                    do {
                      lVar12 = *(long *)(*plVar2 + lVar17 * 8);
                      if (-1 < *(int *)(lVar12 + 0x20)) goto LAB_00103e53;
                      lVar17 = lVar17 + 1;
                    } while (*piVar1 != lVar17);
                  }
LAB_00103e59:
                  lVar12 = 0;
                }
                else {
                  if (*(int *)(lVar12 + 0x20) < 0) goto LAB_00103e59;
LAB_00103e53:
                  *(long *)(lVar21 + 0x50) = lVar12;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 != *(int *)(lVar21 + 0x18));
            }
            lVar21 = *(long *)(lVar21 + 0x70);
          } while( true );
        }
        uVar19 = plVar13->action;
        if ((int)uVar22 < (int)uVar19) {
          memset((void *)((long)lVar8 + (long)(int)uVar22 * 8),0xff,
                 (ulong)(~uVar22 + uVar19) * 8 + 8);
        }
        uVar10 = plVar13->lookahead;
        uVar22 = uVar19;
      }
      if (0 < (int)uVar10) {
        lVar14 = plVar13[1];
        iVar6 = plVar13[3].lookahead;
        iVar15 = iVar6 - uVar10;
        uVar16 = (ulong)uVar10;
        uVar9 = (ulong)(uVar10 - 1);
        do {
          iVar15 = iVar15 + 1;
          if ((*(int *)((long)lVar14 + uVar9 * 8) == iVar6) &&
             (*(int *)((long)lVar14 + 4 + uVar9 * 8) == plVar13[3].action)) {
            iVar3 = plVar13[4].action;
            if (0 < (long)iVar3) {
              lVar21 = 0;
              do {
                iVar20 = *(int *)((long)plVar13[2] + lVar21 * 8);
                uVar19 = (iVar20 - iVar6) + (int)uVar9;
                if (((uVar10 <= uVar19) || (iVar20 != *(int *)((long)lVar14 + (ulong)uVar19 * 8)))
                   || (*(int *)((long)plVar13[2] + 4 + lVar21 * 8) !=
                       *(int *)((long)lVar14 + 4 + (ulong)uVar19 * 8))) goto LAB_00103cd6;
                lVar21 = lVar21 + 1;
              } while (iVar3 != lVar21);
            }
            uVar18 = 0;
            iVar20 = 0;
            do {
              iVar4 = *(int *)((long)lVar14 + uVar18 * 8);
              iVar20 = iVar20 + (uint)(iVar15 + (int)uVar18 == iVar4 && -1 < iVar4);
              uVar18 = uVar18 + 1;
            } while (uVar10 != uVar18);
            if (iVar20 == iVar3) {
              if (0 < (int)uVar16) goto LAB_00103d7e;
              break;
            }
          }
LAB_00103cd6:
          uVar16 = uVar9 & 0xffffffff;
          bVar5 = 0 < (long)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar5);
      }
      uVar19 = uVar22 - plVar13[4].lookahead;
      if (uVar19 == 0 || (int)uVar22 < plVar13[4].lookahead) {
        uVar9 = 0;
      }
      else {
        lVar14 = plVar13[1];
        iVar6 = 0;
        uVar9 = 0;
        do {
          if (*(int *)((long)lVar14 + uVar9 * 8) < 0) {
            if (0 < (long)plVar13[4].action) {
              lVar21 = 0;
              do {
                uVar22 = (*(int *)((long)plVar13[2] + lVar21 * 8) - plVar13[3].lookahead) +
                         (int)uVar9;
                if (((int)uVar22 < 0) || (-1 < *(int *)((long)lVar14 + (ulong)uVar22 * 8)))
                goto LAB_00103d02;
                lVar21 = lVar21 + 1;
              } while (plVar13[4].action != lVar21);
            }
            if ((int)uVar10 < 1) {
              uVar16 = 0;
            }
            else {
              uVar16 = 0;
              while (plVar13[3].lookahead + iVar6 + (int)uVar16 !=
                     *(int *)((long)lVar14 + uVar16 * 8)) {
                uVar16 = uVar16 + 1;
                if (uVar10 == uVar16) goto LAB_00103d7e;
              }
            }
            if ((uint)uVar16 == uVar10) goto LAB_00103d7e;
          }
LAB_00103d02:
          uVar9 = uVar9 + 1;
          iVar6 = iVar6 + -1;
        } while (uVar9 != uVar19);
        uVar9 = (ulong)uVar19;
      }
LAB_00103d7e:
      if (0 < plVar13[4].action) {
        lVar21 = 0;
        do {
          iVar6 = (*(int *)((long)plVar13[2] + lVar21 * 8) - plVar13[3].lookahead) + (int)uVar9;
          *(undefined8 *)((long)plVar13[1] + (long)iVar6 * 8) =
               *(undefined8 *)((long)plVar13[2] + lVar21 * 8);
          if (plVar13->lookahead <= iVar6) {
            plVar13->lookahead = iVar6 + 1;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < plVar13[4].action);
      }
      plVar13[4].action = 0;
      return;
    }
    iVar6 = p->nLookahead;
  }
  if (iVar6 == 0) {
    p->mxLookahead = lookahead;
  }
  else {
    if (p->mxLookahead < lookahead) {
      p->mxLookahead = lookahead;
    }
    if (p->mnLookahead <= lookahead) goto LAB_00103b90;
  }
  p->mnLookahead = lookahead;
  p->mnAction = action;
LAB_00103b90:
  plVar13 = p->aLookahead;
  plVar13[iVar6].lookahead = lookahead;
  plVar13[iVar6].action = action;
  p->nLookahead = iVar6 + 1;
  return;
}

Assistant:

void acttab_action(acttab *p, int lookahead, int action){
  if( p->nLookahead>=p->nLookaheadAlloc ){
    p->nLookaheadAlloc += 25;
    p->aLookahead = (struct lookahead_action *) realloc( p->aLookahead,
                             sizeof(p->aLookahead[0])*p->nLookaheadAlloc );
    if( p->aLookahead==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
  }
  if( p->nLookahead==0 ){
    p->mxLookahead = lookahead;
    p->mnLookahead = lookahead;
    p->mnAction = action;
  }else{
    if( p->mxLookahead<lookahead ) p->mxLookahead = lookahead;
    if( p->mnLookahead>lookahead ){
      p->mnLookahead = lookahead;
      p->mnAction = action;
    }
  }
  p->aLookahead[p->nLookahead].lookahead = lookahead;
  p->aLookahead[p->nLookahead].action = action;
  p->nLookahead++;
}